

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

int __thiscall pfederc::Lexer::nextChar(Lexer *this)

{
  int iVar1;
  
  iVar1 = std::istream::get();
  this->currentChar = iVar1;
  std::__cxx11::string::push_back((char)this + '8');
  this->currentEndIndex = this->currentEndIndex + 1;
  return this->currentChar;
}

Assistant:

int Lexer::nextChar() noexcept {
  currentChar = input.get();
  if (currentChar != std::char_traits<char>::eof()) {
    fileContent += static_cast<char>(currentChar);
  } else
    fileContent += ' ';
  ++currentEndIndex;
  return currentChar;
}